

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::StreamWriterBuilder::validate(StreamWriterBuilder *this,Value *invalid)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  ValueHolder VVar3;
  ValueHolder VVar4;
  ValueHolder VVar5;
  ValueHolder VVar6;
  _Alloc_hider _Var7;
  ArrayIndex AVar8;
  iterator iVar9;
  undefined1 *other;
  ValueHolder *pVVar10;
  long lVar11;
  long lVar12;
  Members keys;
  size_type __dnew;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  valid_keys;
  Value my_invalid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  pointer local_c8;
  Value *local_c0;
  Value *local_b8;
  ValueHolder local_b0;
  ushort local_a8;
  ValueHolder local_a0;
  ValueHolder local_98;
  ValueHolder VStack_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  Value local_58;
  
  local_58._8_2_ = 0;
  local_58.comments_ = (CommentInfo *)0x0;
  local_58.start_ = 0;
  local_58.limit_ = 0;
  local_c0 = invalid;
  if (invalid == (Value *)0x0) {
    local_c0 = &local_58;
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_88);
  paVar1 = &local_e8.field_2;
  local_e8.field_2._M_allocated_capacity._0_7_ = 0x61746e65646e69;
  local_e8.field_2._M_local_buf[7] = 't';
  local_e8.field_2._8_2_ = 0x6f69;
  local_e8.field_2._M_local_buf[10] = 'n';
  local_e8._M_string_length = 0xb;
  local_e8.field_2._M_local_buf[0xb] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_88,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8.field_2._M_allocated_capacity._0_7_ = 0x746e656d6d6f63;
  local_e8.field_2._M_local_buf[7] = 'S';
  local_e8.field_2._8_2_ = 0x7974;
  local_e8.field_2._M_local_buf[10] = 'l';
  local_e8.field_2._M_local_buf[0xb] = 'e';
  local_e8._M_string_length = 0xc;
  local_e8.field_2._M_local_buf[0xc] = '\0';
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_88,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_c8 = (pointer)0x17;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_c8);
  local_e8.field_2._M_allocated_capacity._0_7_ = SUB87(local_c8,0);
  local_e8.field_2._M_local_buf[7] = (char)((ulong)local_c8 >> 0x38);
  builtin_strncpy(local_e8._M_dataplus._M_p,"enableYAMLCompatibility",0x17);
  local_e8._M_string_length = (size_type)local_c8;
  local_e8._M_dataplus._M_p[(long)local_c8] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_88,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_c8 = (pointer)0x14;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_c8);
  local_e8.field_2._M_allocated_capacity._0_7_ = SUB87(local_c8,0);
  local_e8.field_2._M_local_buf[7] = (char)((ulong)local_c8 >> 0x38);
  builtin_strncpy(local_e8._M_dataplus._M_p,"dropNullPlaceholders",0x14);
  local_e8._M_string_length = (size_type)local_c8;
  local_e8._M_dataplus._M_p[(long)local_c8] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_88,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_c8 = (pointer)0x10;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_e8._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)&local_c8);
  local_e8.field_2._M_allocated_capacity._0_7_ = SUB87(local_c8,0);
  local_e8.field_2._M_local_buf[7] = (char)((ulong)local_c8 >> 0x38);
  builtin_strncpy(local_e8._M_dataplus._M_p,"useSpecialFloats",0x10);
  local_e8._M_string_length = (size_type)local_c8;
  local_e8._M_dataplus._M_p[(long)local_c8] = '\0';
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_88,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_e8.field_2._M_allocated_capacity._0_7_ = 0x69736963657270;
  local_e8.field_2._M_local_buf[7] = 'o';
  local_e8.field_2._8_2_ = 0x6e;
  local_e8._M_string_length = 9;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_88,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_b8 = &this->settings_;
  Value::getMemberNames_abi_cxx11_((Members *)&local_e8,local_b8);
  if (local_e8._M_string_length - (long)local_e8._M_dataplus._M_p != 0) {
    lVar11 = (long)(local_e8._M_string_length - (long)local_e8._M_dataplus._M_p) >> 5;
    lVar11 = lVar11 + (ulong)(lVar11 == 0);
    lVar12 = 0;
    do {
      _Var7._M_p = local_e8._M_dataplus._M_p;
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_88,(key_type *)(local_e8._M_dataplus._M_p + lVar12));
      if ((_Rb_tree_header *)iVar9._M_node == &local_88._M_impl.super__Rb_tree_header) {
        other = (undefined1 *)
                Value::find(local_b8,*(char **)(_Var7._M_p + lVar12),
                            *(char **)(_Var7._M_p + lVar12) + *(long *)(_Var7._M_p + lVar12 + 8));
        if ((Value *)other == (Value *)0x0) {
          other = kNull;
        }
        Value::Value((Value *)&local_b0,(Value *)other);
        pVVar10 = &Value::resolveReference
                             (local_c0,*(char **)(_Var7._M_p + lVar12),
                              *(char **)(_Var7._M_p + lVar12) + *(long *)(_Var7._M_p + lVar12 + 8))
                   ->value_;
        uVar2 = *(ushort *)(pVVar10 + 1);
        VVar3 = *pVVar10;
        *pVVar10 = local_b0;
        *(ushort *)(pVVar10 + 1) = local_a8 & 0x1ff | uVar2 & 0xfe00;
        local_a8 = uVar2 & 0x1ff | local_a8 & 0xfe00;
        VVar4 = pVVar10[2];
        pVVar10[2] = local_a0;
        VVar5 = pVVar10[3];
        VVar6 = pVVar10[4];
        pVVar10[3] = local_98;
        pVVar10[4] = VStack_90;
        local_b0 = VVar3;
        local_a0 = VVar4;
        local_98 = VVar5;
        VStack_90 = VVar6;
        Value::~Value((Value *)&local_b0);
      }
      lVar12 = lVar12 + 0x20;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  AVar8 = Value::size(local_c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_88);
  Value::~Value(&local_58);
  return AVar8 == 0;
}

Assistant:

bool StreamWriterBuilder::validate(Json::Value* invalid) const
{
  Json::Value my_invalid;
  if (!invalid) invalid = &my_invalid;  // so we do not need to test for NULL
  Json::Value& inv = *invalid;
  std::set<JSONCPP_STRING> valid_keys;
  getValidWriterKeys(&valid_keys);
  Value::Members keys = settings_.getMemberNames();
  size_t n = keys.size();
  for (size_t i = 0; i < n; ++i) {
    JSONCPP_STRING const& key = keys[i];
    if (valid_keys.find(key) == valid_keys.end()) {
      inv[key] = settings_[key];
    }
  }
  return 0u == inv.size();
}